

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>,slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *pSVar4;
  
  pSVar4 = (SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)this->endPtr < pSVar4 + 1) {
    pSVar4 = (SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)
             allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pSVar4 + 1);
  }
  (pSVar4->super_SyntaxListBase).super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pSVar4->super_SyntaxListBase).super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar4->super_SyntaxListBase).super_SyntaxNode.field_0x4 = uVar3;
  (pSVar4->super_SyntaxListBase).super_SyntaxNode.parent = pSVar1;
  (pSVar4->super_SyntaxListBase).childCount = (args->super_SyntaxListBase).childCount;
  (pSVar4->super_SyntaxListBase)._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005b1c48;
  sVar2 = (args->elements)._M_extent._M_extent_value;
  (pSVar4->elements)._M_ptr = (args->elements)._M_ptr;
  (pSVar4->elements)._M_extent._M_extent_value = sVar2;
  return pSVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }